

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O1

_Bool plutovg_parse_number(char **begin,char *end,float *number)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  char *pcVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pbVar2 = (byte *)*begin;
  fVar7 = 1.0;
  if (pbVar2 < end) {
    if (*pbVar2 == 0x2d) {
      pbVar2 = pbVar2 + 1;
      fVar7 = -1.0;
    }
    else if (*pbVar2 == 0x2b) {
      pbVar2 = pbVar2 + 1;
    }
  }
  if ((pbVar2 < end) && (bVar5 = *pbVar2 - 0x30, *pbVar2 == 0x2e || bVar5 < 10)) {
    fVar11 = 0.0;
    if (bVar5 < 10) {
      pcVar6 = end + ~(ulong)pbVar2;
      fVar10 = 0.0;
      pbVar3 = pbVar2;
      do {
        fVar10 = fVar10 * 10.0 + (float)((char)*pbVar3 + -0x30);
        pbVar2 = (byte *)end;
        if (pcVar6 == (char *)0x0) break;
        pbVar4 = pbVar3 + 1;
        pbVar2 = pbVar3 + 1;
        pcVar6 = pcVar6 + -1;
        pbVar3 = pbVar2;
      } while ((byte)(*pbVar4 - 0x30) < 10);
    }
    else {
      fVar10 = 0.0;
    }
    if ((pbVar2 < end) && (*pbVar2 == 0x2e)) {
      pbVar3 = pbVar2 + 1;
      if ((end <= pbVar3) || (9 < (byte)(*pbVar3 - 0x30))) goto LAB_0011075f;
      pcVar6 = end + (-2 - (long)pbVar2);
      fVar8 = 1.0;
      fVar11 = 0.0;
      do {
        fVar11 = fVar11 * 10.0 + (float)((char)*pbVar3 + -0x30);
        fVar8 = fVar8 * 10.0;
        pbVar2 = (byte *)end;
        if (pcVar6 == (char *)0x0) break;
        pbVar4 = pbVar3 + 1;
        pbVar2 = pbVar3 + 1;
        pcVar6 = pcVar6 + -1;
        pbVar3 = pbVar2;
      } while ((byte)(*pbVar4 - 0x30) < 10);
      fVar11 = fVar11 / fVar8;
    }
    fVar8 = 1.0;
    if ((pbVar2 < end) && ((*pbVar2 | 0x20) == 0x65)) {
      pbVar3 = pbVar2 + 1;
      fVar8 = 1.0;
      pbVar4 = pbVar3;
      if (pbVar3 < end) {
        bVar5 = *pbVar3;
        pbVar4 = pbVar2 + 2;
        if (bVar5 != 0x2b) {
          if (bVar5 == 0x2d) {
            pbVar3 = pbVar4;
          }
          fVar8 = *(float *)(&DAT_001291cc + (ulong)(bVar5 == 0x2d) * 4);
          pbVar4 = pbVar3;
        }
      }
      if ((end <= pbVar4) || (9 < (byte)(*pbVar4 - 0x30))) goto LAB_0011075f;
      pcVar6 = end + ~(ulong)pbVar4;
      fVar9 = 0.0;
      do {
        fVar9 = fVar9 * 10.0 + (float)((char)*pbVar4 + -0x30);
        pbVar2 = (byte *)end;
        if (pcVar6 == (char *)0x0) break;
        pbVar3 = pbVar4 + 1;
        pbVar2 = pbVar4 + 1;
        pcVar6 = pcVar6 + -1;
        pbVar4 = pbVar2;
      } while ((byte)(*pbVar3 - 0x30) < 10);
    }
    else {
      fVar9 = 0.0;
    }
    *begin = (char *)pbVar2;
    *number = fVar7 * (fVar10 + fVar11);
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      fVar7 = powf(10.0,fVar9 * fVar8);
      *number = fVar7 * *number;
    }
    bVar1 = ABS(*number) <= 3.4028235e+38;
  }
  else {
LAB_0011075f:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static inline bool plutovg_parse_number(const char** begin, const char* end, float* number)
{
    const char* it = *begin;
    float integer = 0;
    float fraction = 0;
    float exponent = 0;
    int sign = 1;
    int expsign = 1;

    if(it < end && *it == '+') {
        ++it;
    } else if(it < end && *it == '-') {
        ++it;
        sign = -1;
    }

    if(it >= end || (*it != '.' && !PLUTOVG_IS_NUM(*it)))
        return false;
    if(PLUTOVG_IS_NUM(*it)) {
        do {
            integer = 10.f * integer + (*it++ - '0');
        } while(it < end && PLUTOVG_IS_NUM(*it));
    }

    if(it < end && *it == '.') {
        ++it;
        if(it >= end || !PLUTOVG_IS_NUM(*it))
            return false;
        float divisor = 1.f;
        do {
            fraction = 10.f * fraction + (*it++ - '0');
            divisor *= 10.f;
        } while(it < end && PLUTOVG_IS_NUM(*it));
        fraction /= divisor;
    }

    if(it < end && (*it == 'e' || *it == 'E')) {
        ++it;
        if(it < end && *it == '+') {
            ++it;
        } else if(it < end && *it == '-') {
            ++it;
            expsign = -1;
        }

        if(it >= end || !PLUTOVG_IS_NUM(*it))
            return false;
        do {
            exponent = 10 * exponent + (*it++ - '0');
        } while(it < end && PLUTOVG_IS_NUM(*it));
    }

    *begin = it;
    *number = sign * (integer + fraction);
    if(exponent)
        *number *= powf(10.f, expsign * exponent);
    return *number >= -FLT_MAX && *number <= FLT_MAX;
}